

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

string * __thiscall
soul::heart::IODeclaration::getTypesDescription_abi_cxx11_
          (string *__return_storage_ptr__,IODeclaration *this)

{
  Type *this_00;
  long lVar1;
  ulong uVar2;
  allocator<char> local_71;
  string local_70 [32];
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>(local_70,", ",&local_71);
  this_00 = (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (this_00 ==
      (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    Type::getDescription_abi_cxx11_(__return_storage_ptr__,this_00);
    lVar1 = 0x18;
    for (uVar2 = 1;
        uVar2 < (ulong)(((long)(this->dataTypes).
                               super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->dataTypes).
                              super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
                              super__Vector_impl_data._M_start) / 0x18); uVar2 = uVar2 + 1) {
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      Type::getDescription_abi_cxx11_
                (&local_50,
                 (Type *)(&((this->dataTypes).
                            super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
                            super__Vector_impl_data._M_start)->category + lVar1));
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
      lVar1 = lVar1 + 0x18;
    }
  }
  std::__cxx11::string::~string(local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string getTypesDescription() const
        {
            return joinStrings (dataTypes, ", ", [] (auto& t) { return t.getDescription(); });
        }